

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts,ConstType type)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Type type_1;
  Location local_e8;
  Const const_;
  Token token;
  
  do {
    bVar1 = PeekMatchLpar(this,Const);
    if ((((!bVar1) && (bVar1 = PeekMatchLpar(this,RefNull), !bVar1)) &&
        (bVar1 = PeekMatchLpar(this,RefExtern), !bVar1)) &&
       (bVar1 = PeekMatchLpar(this,RefFunc), !bVar1)) {
      return (Result)Ok;
    }
    Consume((Token *)&const_,this);
    Const::Const(&const_);
    TVar2 = Peek(this,0);
    if (TVar2 == RefNull) {
      Consume(&token,this);
      RVar3 = ParseRefKind(this,&type_1);
      if (RVar3.enum_ == Error) {
        return (Result)Error;
      }
      ErrorUnlessOpcodeEnabled(this,&token);
      GetLocation(&local_e8,this);
      const_.loc.field_1.field_1.offset = local_e8.field_1.field_1.offset;
      const_.loc.field_1._8_8_ = local_e8.field_1._8_8_;
      const_.loc.filename._M_len = local_e8.filename._M_len;
      const_.loc.filename._M_str = local_e8.filename._M_str;
      Const::set_null(&const_,type_1);
    }
    else {
      if (TVar2 == RefExtern) {
        RVar3 = ParseExternref(this,&const_);
      }
      else {
        if (TVar2 == RefFunc) {
          Consume(&token,this);
          ErrorUnlessOpcodeEnabled(this,&token);
          GetLocation(&local_e8,this);
          const_.loc.field_1.field_1.offset = local_e8.field_1.field_1.offset;
          const_.loc.field_1._8_8_ = local_e8.field_1._8_8_;
          const_.loc.filename._M_len = local_e8.filename._M_len;
          const_.loc.filename._M_str = local_e8.filename._M_str;
          Const::set_funcref(&const_);
          goto LAB_0013c333;
        }
        if (TVar2 != Const) {
          __assert_fail("!\"unreachable\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0xbd8,"Result wabt::WastParser::ParseConstList(ConstVector *, ConstType)");
        }
        RVar3 = ParseConst(this,&const_,type);
      }
      if (RVar3.enum_ == Error) {
        return (Result)Error;
      }
    }
LAB_0013c333:
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    std::vector<wabt::Const,_std::allocator<wabt::Const>_>::push_back(consts,&const_);
  } while( true );
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts, ConstType type) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const) || PeekMatchLpar(TokenType::RefNull) ||
         PeekMatchLpar(TokenType::RefExtern) ||
         PeekMatchLpar(TokenType::RefFunc)) {
    Consume();
    Const const_;
    switch (Peek()) {
      case TokenType::Const:
        CHECK_RESULT(ParseConst(&const_, type));
        break;
      case TokenType::RefNull: {
        auto token = Consume();
        Type type;
        CHECK_RESULT(ParseRefKind(&type));
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_null(type);
        break;
      }
      case TokenType::RefFunc: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_funcref();
        break;
      }
      case TokenType::RefExtern:
        CHECK_RESULT(ParseExternref(&const_));
        break;
      default:
        assert(!"unreachable");
        return Result::Error;
    }
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}